

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void ImGui::ListBoxFooter(void)

{
  ImGuiContext *pIVar1;
  ImGuiWindow *pIVar2;
  ImRect bb;
  ImRect local_28;
  
  pIVar2 = GetParentWindow();
  pIVar1 = GImGui;
  local_28.Min = (pIVar2->DC).LastItemRect.Min;
  local_28.Max = (pIVar2->DC).LastItemRect.Max;
  EndChildFrame();
  SameLine(0.0,-1.0);
  (pIVar2->DC).CursorPos = local_28.Min;
  ItemSize(&local_28,(pIVar1->Style).FramePadding.y);
  EndGroup();
  return;
}

Assistant:

void ImGui::ListBoxFooter()
{
    ImGuiWindow* parent_window = GetParentWindow();
    const ImRect bb = parent_window->DC.LastItemRect;
    const ImGuiStyle& style = GetStyle();

    EndChildFrame();

    // Redeclare item size so that it includes the label (we have stored the full size in LastItemRect)
    // We call SameLine() to restore DC.CurrentLine* data
    SameLine();
    parent_window->DC.CursorPos = bb.Min;
    ItemSize(bb, style.FramePadding.y);
    EndGroup();
}